

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>::UntypedPerformAction
          (FunctionMockerBase<void_(int,_int,_mp::ComplInfo)> *this,void *untyped_action,
          void *untyped_args)

{
  Action<void_(int,_int,_mp::ComplInfo)> action;
  linked_ptr<testing::ActionInterface<void_(int,_int,_mp::ComplInfo)>_> local_20;
  
  linked_ptr<testing::ActionInterface<void(int,int,mp::ComplInfo)>>::
  copy<testing::ActionInterface<void(int,int,mp::ComplInfo)>>
            ((linked_ptr<testing::ActionInterface<void(int,int,mp::ComplInfo)>> *)&local_20,
             (linked_ptr<testing::ActionInterface<void_(int,_int,_mp::ComplInfo)>_> *)untyped_action
            );
  Action<void_(int,_int,_mp::ComplInfo)>::Perform
            ((Action<void_(int,_int,_mp::ComplInfo)> *)&local_20,(ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<void_(int,_int,_mp::ComplInfo)>_>::~linked_ptr(&local_20);
  return (UntypedActionResultHolderBase *)0x0;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }